

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void __thiscall FFlagCVar::FFlagCVar(FFlagCVar *this,char *name,FIntCVar *realvar,DWORD bitval)

{
  uint32 *puVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = 0;
  FBaseCVar::FBaseCVar(&this->super_FBaseCVar,name,0,(_func_void_FBaseCVar_ptr *)0x0);
  (this->super_FBaseCVar)._vptr_FBaseCVar = (_func_int **)&PTR__FBaseCVar_006ec0d0;
  this->ValueVar = realvar;
  this->BitVal = bitval;
  puVar1 = &(this->super_FBaseCVar).Flags;
  *(byte *)puVar1 = (byte)*puVar1 & 0x7f;
  uVar2 = bitval;
  if (bitval == 0) {
    __assert_fail("bitval != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_cvars.cpp"
                  ,0x43a,"FFlagCVar::FFlagCVar(const char *, FIntCVar &, DWORD)");
  }
  for (; 1 < uVar2; uVar2 = uVar2 >> 1) {
    iVar3 = iVar3 + 1;
  }
  this->BitNum = iVar3;
  if (1 << ((byte)iVar3 & 0x1f) != bitval) {
    __assert_fail("(1u << BitNum) == BitVal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_cvars.cpp"
                  ,0x443,"FFlagCVar::FFlagCVar(const char *, FIntCVar &, DWORD)");
  }
  return;
}

Assistant:

FFlagCVar::FFlagCVar (const char *name, FIntCVar &realvar, DWORD bitval)
: FBaseCVar (name, 0, NULL),
ValueVar (realvar),
BitVal (bitval)
{
	int bit;

	Flags &= ~CVAR_ISDEFAULT;

	assert (bitval != 0);

	bit = 0;
	while ((bitval >>= 1) != 0)
	{
		++bit;
	}
	BitNum = bit;

	assert ((1u << BitNum) == BitVal);
}